

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS ref_phys_wall_distance(REF_GRID ref_grid,REF_DICT ref_dict,REF_DBL *distance)

{
  uint uVar1;
  int local_1d4;
  int local_1ac;
  int local_184;
  int local_174;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i_2;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_DBL scale;
  REF_DBL radius;
  REF_DBL center [3];
  REF_SEARCH local_e8;
  REF_SEARCH ref_search;
  REF_INT *pRStack_d8;
  REF_INT i;
  REF_INT *permutation;
  REF_INT cell;
  REF_INT node;
  REF_INT node_per;
  REF_INT local_node_per;
  REF_DBL *xyz;
  REF_DBL *local_xyz;
  REF_DBL *b_dist;
  REF_DBL *a_dist;
  REF_DBL *b_xyz;
  REF_DBL *a_xyz;
  REF_INT *a_next;
  REF_INT *b_size;
  REF_INT *a_size;
  REF_INT b_total;
  REF_INT a_total;
  REF_INT part;
  REF_INT nnode;
  REF_INT max_ncell;
  REF_INT part_complete;
  REF_INT *part_ncell;
  REF_INT local_ncell;
  REF_INT ncell;
  REF_INT *stationary;
  int local_40;
  REF_INT nstationary;
  REF_INT nbalance;
  REF_INT nowned;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  REF_DBL *distance_local;
  REF_DICT ref_dict_local;
  REF_GRID ref_grid_local;
  
  ref_node = (REF_NODE)ref_grid->mpi;
  _nbalance = ref_grid->node;
  if (ref_grid->twod == 0) {
    cell = 3;
  }
  else {
    cell = 2;
  }
  ref_mpi = (REF_MPI)distance;
  distance_local = (REF_DBL *)ref_dict;
  ref_dict_local = (REF_DICT)ref_grid;
  if (ref_node->n < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x6dc,
           "ref_phys_wall_distance","malloc a_size of REF_INT negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    b_size = (REF_INT *)malloc((long)ref_node->n << 2);
    if (b_size == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x6dc,
             "ref_phys_wall_distance","malloc a_size of REF_INT NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      for (ref_malloc_init_i_2 = 0; ref_malloc_init_i_2 < ref_node->n;
          ref_malloc_init_i_2 = ref_malloc_init_i_2 + 1) {
        b_size[ref_malloc_init_i_2] = 0;
      }
      if (ref_node->n < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x6dd,"ref_phys_wall_distance","malloc b_size of REF_INT negative");
        ref_grid_local._4_4_ = 1;
      }
      else {
        a_next = (REF_INT *)malloc((long)ref_node->n << 2);
        if (a_next == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x6dd,"ref_phys_wall_distance","malloc b_size of REF_INT NULL");
          ref_grid_local._4_4_ = 2;
        }
        else {
          for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < ref_node->n;
              ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
            a_next[ref_private_macro_code_rss] = 0;
          }
          nstationary = 0;
          for (permutation._4_4_ = 0; permutation._4_4_ < _nbalance->max;
              permutation._4_4_ = permutation._4_4_ + 1) {
            if ((((-1 < permutation._4_4_) && (permutation._4_4_ < _nbalance->max)) &&
                (-1 < _nbalance->global[permutation._4_4_])) &&
               (_nbalance->ref_mpi->id == _nbalance->part[permutation._4_4_])) {
              nstationary = nstationary + 1;
            }
          }
          if (nstationary < (int)(0x7fffffff / (long)ref_node->n)) {
            local_174 = nstationary;
          }
          else {
            local_174 = (int)(0x7fffffff / (long)ref_node->n);
          }
          local_40 = local_174;
          a_total = 0;
          stationary._4_4_ = 0;
          for (permutation._4_4_ = 0; permutation._4_4_ < _nbalance->max;
              permutation._4_4_ = permutation._4_4_ + 1) {
            if (((-1 < permutation._4_4_) && (permutation._4_4_ < _nbalance->max)) &&
               ((-1 < _nbalance->global[permutation._4_4_] &&
                ((_nbalance->ref_mpi->id == _nbalance->part[permutation._4_4_] &&
                 (a_total < local_174)))))) {
              if (a_total / ((local_174 + ref_node->n + -1) / ref_node->n) <
                  local_174 - ref_node->n * ((local_174 + -1) / ref_node->n)) {
                local_184 = a_total / ((local_174 + ref_node->n + -1) / ref_node->n);
              }
              else {
                local_184 = (a_total -
                            (local_174 - ref_node->n * ((local_174 + -1) / ref_node->n)) *
                            ((local_174 + ref_node->n + -1) / ref_node->n)) /
                            ((local_174 + -1) / ref_node->n) +
                            (local_174 - ref_node->n * ((local_174 + -1) / ref_node->n));
              }
              b_total = local_184;
              if (ref_node->max == local_184) {
                stationary._4_4_ = stationary._4_4_ + 1;
              }
              else {
                b_size[local_184] = b_size[local_184] + 1;
              }
              a_total = a_total + 1;
            }
          }
          if (stationary._4_4_ < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x6f8,"ref_phys_wall_distance","malloc stationary of REF_INT negative");
            ref_grid_local._4_4_ = 1;
          }
          else {
            _local_ncell = malloc((long)stationary._4_4_ << 2);
            if (_local_ncell == (void *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                     ,0x6f8,"ref_phys_wall_distance","malloc stationary of REF_INT NULL");
              ref_grid_local._4_4_ = 2;
            }
            else {
              for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < stationary._4_4_
                  ; ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                *(undefined4 *)((long)_local_ncell + (long)ref_private_macro_code_rss_1 * 4) =
                     0xffffffff;
              }
              uVar1 = ref_mpi_alltoall((REF_MPI)ref_node,b_size,a_next,1);
              if (uVar1 == 0) {
                a_size._4_4_ = 0;
                for (b_total = 0; b_total < ref_node->n; b_total = b_total + 1) {
                  a_size._4_4_ = b_size[b_total] + a_size._4_4_;
                }
                if (a_size._4_4_ * 3 < 0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                         ,0x6ff,"ref_phys_wall_distance","malloc a_xyz of REF_DBL negative");
                  ref_grid_local._4_4_ = 1;
                }
                else {
                  b_xyz = (REF_DBL *)malloc((long)(a_size._4_4_ * 3) << 3);
                  if (b_xyz == (REF_DBL *)0x0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                           ,0x6ff,"ref_phys_wall_distance","malloc a_xyz of REF_DBL NULL");
                    ref_grid_local._4_4_ = 2;
                  }
                  else if (a_size._4_4_ < 0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                           ,0x700,"ref_phys_wall_distance","malloc a_dist of REF_DBL negative");
                    ref_grid_local._4_4_ = 1;
                  }
                  else {
                    b_dist = (REF_DBL *)malloc((long)a_size._4_4_ << 3);
                    if (b_dist == (REF_DBL *)0x0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                             ,0x700,"ref_phys_wall_distance","malloc a_dist of REF_DBL NULL");
                      ref_grid_local._4_4_ = 2;
                    }
                    else {
                      a_size._0_4_ = 0;
                      for (b_total = 0; b_total < ref_node->n; b_total = b_total + 1) {
                        a_size._0_4_ = a_next[b_total] + (int)a_size;
                      }
                      if ((int)a_size * 3 < 0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                               ,0x704,"ref_phys_wall_distance","malloc b_xyz of REF_DBL negative");
                        ref_grid_local._4_4_ = 1;
                      }
                      else {
                        a_dist = (REF_DBL *)malloc((long)((int)a_size * 3) << 3);
                        if (a_dist == (REF_DBL *)0x0) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                 ,0x704,"ref_phys_wall_distance","malloc b_xyz of REF_DBL NULL");
                          ref_grid_local._4_4_ = 2;
                        }
                        else if ((int)a_size < 0) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                 ,0x705,"ref_phys_wall_distance","malloc b_dist of REF_DBL negative"
                                );
                          ref_grid_local._4_4_ = 1;
                        }
                        else {
                          local_xyz = (REF_DBL *)malloc((long)(int)a_size << 3);
                          if (local_xyz == (REF_DBL *)0x0) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                   ,0x705,"ref_phys_wall_distance","malloc b_dist of REF_DBL NULL");
                            ref_grid_local._4_4_ = 2;
                          }
                          else if (ref_node->n < 0) {
                            printf("%s: %d: %s: %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                   ,0x707,"ref_phys_wall_distance",
                                   "malloc a_next of REF_INT negative");
                            ref_grid_local._4_4_ = 1;
                          }
                          else {
                            a_xyz = (REF_DBL *)malloc((long)ref_node->n << 2);
                            if (a_xyz == (REF_DBL *)0x0) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                     ,0x707,"ref_phys_wall_distance","malloc a_next of REF_INT NULL"
                                    );
                              ref_grid_local._4_4_ = 2;
                            }
                            else {
                              *(undefined4 *)a_xyz = 0;
                              for (b_total = 1; b_total < ref_node->n; b_total = b_total + 1) {
                                *(int *)((long)a_xyz + (long)b_total * 4) =
                                     *(int *)((long)a_xyz + (long)(b_total + -1) * 4) +
                                     b_size[b_total + -1];
                              }
                              a_total = 0;
                              stationary._4_4_ = 0;
                              for (permutation._4_4_ = 0; permutation._4_4_ < _nbalance->max;
                                  permutation._4_4_ = permutation._4_4_ + 1) {
                                if ((((-1 < permutation._4_4_) &&
                                     (permutation._4_4_ < _nbalance->max)) &&
                                    (-1 < _nbalance->global[permutation._4_4_])) &&
                                   ((_nbalance->ref_mpi->id == _nbalance->part[permutation._4_4_] &&
                                    (a_total < local_40)))) {
                                  if (a_total / ((local_40 + ref_node->n + -1) / ref_node->n) <
                                      local_40 - ref_node->n * ((local_40 + -1) / ref_node->n)) {
                                    local_1ac = a_total / ((local_40 + ref_node->n + -1) /
                                                          ref_node->n);
                                  }
                                  else {
                                    local_1ac = (a_total -
                                                (local_40 -
                                                ref_node->n * ((local_40 + -1) / ref_node->n)) *
                                                ((local_40 + ref_node->n + -1) / ref_node->n)) /
                                                ((local_40 + -1) / ref_node->n) +
                                                (local_40 -
                                                ref_node->n * ((local_40 + -1) / ref_node->n));
                                  }
                                  b_total = local_1ac;
                                  if (ref_node->max == local_1ac) {
                                    *(int *)((long)_local_ncell + (long)stationary._4_4_ * 4) =
                                         permutation._4_4_;
                                    stationary._4_4_ = stationary._4_4_ + 1;
                                  }
                                  else {
                                    for (ref_search._4_4_ = 0; ref_search._4_4_ < 3;
                                        ref_search._4_4_ = ref_search._4_4_ + 1) {
                                      b_xyz[ref_search._4_4_ +
                                            *(int *)((long)a_xyz + (long)local_1ac * 4) * 3] =
                                           _nbalance->real
                                           [ref_search._4_4_ + permutation._4_4_ * 0xf];
                                    }
                                    *(int *)((long)a_xyz + (long)local_1ac * 4) =
                                         *(int *)((long)a_xyz + (long)local_1ac * 4) + 1;
                                  }
                                  a_total = a_total + 1;
                                }
                              }
                              uVar1 = ref_mpi_alltoallv((REF_MPI)ref_node,b_xyz,b_size,a_dist,a_next
                                                        ,3,3);
                              if (uVar1 == 0) {
                                for (permutation._4_4_ = 0; permutation._4_4_ < (int)a_size;
                                    permutation._4_4_ = permutation._4_4_ + 1) {
                                  local_xyz[permutation._4_4_] = 1e+200;
                                }
                                for (permutation._4_4_ = 0; permutation._4_4_ < _nbalance->max;
                                    permutation._4_4_ = permutation._4_4_ + 1) {
                                  if (((-1 < permutation._4_4_) &&
                                      (permutation._4_4_ < _nbalance->max)) &&
                                     (-1 < _nbalance->global[permutation._4_4_])) {
                                    *(undefined8 *)(&ref_mpi->n + (long)permutation._4_4_ * 2) =
                                         0x6974e718d7d7625a;
                                  }
                                }
                                uVar1 = ref_phys_local_wall((REF_GRID)ref_dict_local,
                                                            (REF_DICT)distance_local,&node,
                                                            (REF_INT *)&part_ncell,&xyz);
                                if (uVar1 == 0) {
                                  if ((long)cell == (long)node) {
                                    if (ref_node->n < 0) {
                                      printf("%s: %d: %s: %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                             ,0x72f,"ref_phys_wall_distance",
                                             "malloc part_ncell of REF_INT negative");
                                      ref_grid_local._4_4_ = 1;
                                    }
                                    else {
                                      _max_ncell = (REF_INT *)malloc((long)ref_node->n << 2);
                                      if (_max_ncell == (REF_INT *)0x0) {
                                        printf("%s: %d: %s: %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                               ,0x72f,"ref_phys_wall_distance",
                                               "malloc part_ncell of REF_INT NULL");
                                        ref_grid_local._4_4_ = 2;
                                      }
                                      else {
                                        uVar1 = ref_mpi_allgather((REF_MPI)ref_node,&part_ncell,
                                                                  _max_ncell,1);
                                        if (uVar1 == 0) {
                                          part = 1000000;
                                          nnode = 0;
                                          while (nnode < ref_node->n) {
                                            _node_per = (REF_DBL *)0x0;
                                            part_ncell._4_4_ = 0;
                                            uVar1 = ref_phys_bcast_parts
                                                              ((REF_MPI)ref_node,&nnode,_max_ncell,
                                                               part,cell,xyz,
                                                               (REF_INT *)((long)&part_ncell + 4),
                                                               (REF_DBL **)&node_per);
                                            if (uVar1 != 0) {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                                  ,0x73b,"ref_phys_wall_distance",(ulong)uVar1,
                                                  "bcast part");
                                              return uVar1;
                                            }
                                            uVar1 = ref_search_create(&local_e8,part_ncell._4_4_);
                                            if (uVar1 != 0) {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                                  ,0x73d,"ref_phys_wall_distance",(ulong)uVar1,
                                                  "make search");
                                              return uVar1;
                                            }
                                            if (part_ncell._4_4_ < 0) {
                                              printf("%s: %d: %s: %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                                  ,0x73e,"ref_phys_wall_distance",
                                                  "malloc permutation of REF_INT negative");
                                              return 1;
                                            }
                                            pRStack_d8 = (REF_INT *)
                                                         malloc((long)part_ncell._4_4_ << 2);
                                            if (pRStack_d8 == (REF_INT *)0x0) {
                                              printf("%s: %d: %s: %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                                  ,0x73e,"ref_phys_wall_distance",
                                                  "malloc permutation of REF_INT NULL");
                                              return 2;
                                            }
                                            uVar1 = ref_sort_shuffle(part_ncell._4_4_,pRStack_d8);
                                            if (uVar1 != 0) {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                                  ,0x740,"ref_phys_wall_distance",(ulong)uVar1,
                                                  "shuffle");
                                              return uVar1;
                                            }
                                            for (ref_search._4_4_ = 0;
                                                ref_search._4_4_ < part_ncell._4_4_;
                                                ref_search._4_4_ = ref_search._4_4_ + 1) {
                                              permutation._0_4_ = pRStack_d8[ref_search._4_4_];
                                              uVar1 = ref_node_bounding_sphere_xyz
                                                                (_node_per +
                                                                 cell * 3 * (int)permutation,cell,
                                                                 &radius,&scale);
                                              if (uVar1 != 0) {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                                  ,0x745,"ref_phys_wall_distance",(ulong)uVar1,
                                                  "bound");
                                                return uVar1;
                                              }
                                              uVar1 = ref_search_insert(local_e8,(int)permutation,
                                                                        &radius,scale * 1.00000001);
                                              if (uVar1 != 0) {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                                  ,0x746,"ref_phys_wall_distance",(ulong)uVar1,"ins"
                                                  );
                                                return uVar1;
                                              }
                                            }
                                            if (pRStack_d8 != (REF_INT *)0x0) {
                                              free(pRStack_d8);
                                            }
                                            for (ref_search._4_4_ = 0;
                                                ref_search._4_4_ < (int)a_size;
                                                ref_search._4_4_ = ref_search._4_4_ + 1) {
                                              uVar1 = ref_search_nearest_element
                                                                (local_e8,cell,_node_per,
                                                                 a_dist + ref_search._4_4_ * 3,
                                                                 local_xyz + ref_search._4_4_);
                                              if (uVar1 != 0) {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                                  ,0x74d,"ref_phys_wall_distance",(ulong)uVar1,
                                                  "balanced candidates");
                                                return uVar1;
                                              }
                                            }
                                            for (ref_search._4_4_ = 0;
                                                ref_search._4_4_ < stationary._4_4_;
                                                ref_search._4_4_ = ref_search._4_4_ + 1) {
                                              permutation._4_4_ =
                                                   *(int *)((long)_local_ncell +
                                                           (long)ref_search._4_4_ * 4);
                                              uVar1 = ref_search_nearest_element
                                                                (local_e8,cell,_node_per,
                                                                 (REF_DBL *)
                                                                 (*(long *)(*(long *)&ref_dict_local
                                                                                      ->naux + 0x38)
                                                                 + (long)(permutation._4_4_ * 0xf) *
                                                                   8),(REF_DBL *)
                                                                      (&ref_mpi->n +
                                                                      (long)permutation._4_4_ * 2));
                                              if (uVar1 != 0) {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                                  ,0x755,"ref_phys_wall_distance",(ulong)uVar1,
                                                  "stationary candidates");
                                                return uVar1;
                                              }
                                            }
                                            uVar1 = ref_search_free(local_e8);
                                            if (uVar1 != 0) {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                                  ,0x757,"ref_phys_wall_distance",(ulong)uVar1,
                                                  "free");
                                              return uVar1;
                                            }
                                            if (_node_per != (REF_DBL *)0x0) {
                                              free(_node_per);
                                            }
                                          }
                                          if (_max_ncell != (REF_INT *)0x0) {
                                            free(_max_ncell);
                                          }
                                          if (xyz != (REF_DBL *)0x0) {
                                            free(xyz);
                                          }
                                          uVar1 = ref_mpi_alltoallv((REF_MPI)ref_node,local_xyz,
                                                                    a_next,b_dist,b_size,1,3);
                                          if (uVar1 == 0) {
                                            *(undefined4 *)a_xyz = 0;
                                            for (b_total = 1; b_total < ref_node->n;
                                                b_total = b_total + 1) {
                                              *(int *)((long)a_xyz + (long)b_total * 4) =
                                                   *(int *)((long)a_xyz + (long)(b_total + -1) * 4)
                                                   + b_size[b_total + -1];
                                            }
                                            a_total = 0;
                                            for (permutation._4_4_ = 0;
                                                permutation._4_4_ < _nbalance->max;
                                                permutation._4_4_ = permutation._4_4_ + 1) {
                                              if ((((-1 < permutation._4_4_) &&
                                                   (permutation._4_4_ < _nbalance->max)) &&
                                                  (-1 < _nbalance->global[permutation._4_4_])) &&
                                                 ((_nbalance->ref_mpi->id ==
                                                   _nbalance->part[permutation._4_4_] &&
                                                  (a_total < local_40)))) {
                                                if (a_total / ((local_40 + ref_node->n + -1) /
                                                              ref_node->n) <
                                                    local_40 -
                                                    ref_node->n * ((local_40 + -1) / ref_node->n)) {
                                                  local_1d4 = a_total / ((local_40 + ref_node->n +
                                                                         -1) / ref_node->n);
                                                }
                                                else {
                                                  local_1d4 = (a_total -
                                                              (local_40 -
                                                              ref_node->n *
                                                              ((local_40 + -1) / ref_node->n)) *
                                                              ((local_40 + ref_node->n + -1) /
                                                              ref_node->n)) /
                                                              ((local_40 + -1) / ref_node->n) +
                                                              (local_40 -
                                                              ref_node->n *
                                                              ((local_40 + -1) / ref_node->n));
                                                }
                                                b_total = local_1d4;
                                                if (ref_node->max != local_1d4) {
                                                  *(REF_DBL *)
                                                   (&ref_mpi->n + (long)permutation._4_4_ * 2) =
                                                       b_dist[*(int *)((long)a_xyz +
                                                                      (long)local_1d4 * 4)];
                                                  *(int *)((long)a_xyz + (long)local_1d4 * 4) =
                                                       *(int *)((long)a_xyz + (long)local_1d4 * 4) +
                                                       1;
                                                }
                                                a_total = a_total + 1;
                                              }
                                            }
                                            uVar1 = ref_node_ghost_dbl(_nbalance,(REF_DBL *)ref_mpi,
                                                                       1);
                                            if (uVar1 == 0) {
                                              if (local_xyz != (REF_DBL *)0x0) {
                                                free(local_xyz);
                                              }
                                              if (a_dist != (REF_DBL *)0x0) {
                                                free(a_dist);
                                              }
                                              if (b_dist != (REF_DBL *)0x0) {
                                                free(b_dist);
                                              }
                                              if (b_xyz != (REF_DBL *)0x0) {
                                                free(b_xyz);
                                              }
                                              if (a_xyz != (REF_DBL *)0x0) {
                                                free(a_xyz);
                                              }
                                              if (_local_ncell != (void *)0x0) {
                                                free(_local_ncell);
                                              }
                                              if (a_next != (REF_INT *)0x0) {
                                                free(a_next);
                                              }
                                              if (b_size != (REF_INT *)0x0) {
                                                free(b_size);
                                              }
                                              ref_grid_local._4_4_ = 0;
                                            }
                                            else {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                                  ,0x776,"ref_phys_wall_distance",(ulong)uVar1,
                                                  "ghost distance");
                                              ref_grid_local._4_4_ = uVar1;
                                            }
                                          }
                                          else {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                                  ,0x761,"ref_phys_wall_distance",(ulong)uVar1,
                                                  "alltoallv dist");
                                            ref_grid_local._4_4_ = uVar1;
                                          }
                                        }
                                        else {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                                 ,0x731,"ref_phys_wall_distance",(ulong)uVar1,
                                                 "allgather part ncell");
                                          ref_grid_local._4_4_ = uVar1;
                                        }
                                      }
                                    }
                                  }
                                  else {
                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                           ,0x72d,"ref_phys_wall_distance","node_per miss match",
                                           (long)cell,(long)node);
                                    ref_grid_local._4_4_ = 1;
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                         ,0x72c,"ref_phys_wall_distance",(ulong)uVar1,"local wall");
                                  ref_grid_local._4_4_ = uVar1;
                                }
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                                       ,0x723,"ref_phys_wall_distance",(ulong)uVar1,"alltoallv xyz")
                                ;
                                ref_grid_local._4_4_ = uVar1;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                       ,0x6fb,"ref_phys_wall_distance",(ulong)uVar1,"alltoall sizes");
                ref_grid_local._4_4_ = uVar1;
              }
            }
          }
        }
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_phys_wall_distance(REF_GRID ref_grid, REF_DICT ref_dict,
                                          REF_DBL *distance) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT nowned, nbalance, nstationary, *stationary;
  REF_INT ncell, local_ncell, *part_ncell, part_complete, max_ncell;
  REF_INT nnode, part;
  REF_INT a_total, b_total;
  REF_INT *a_size, *b_size;
  REF_INT *a_next;
  REF_DBL *a_xyz, *b_xyz;
  REF_DBL *a_dist, *b_dist;
  REF_DBL *local_xyz, *xyz;
  REF_INT local_node_per, node_per;
  REF_INT node, cell;
  REF_INT *permutation, i;
  REF_SEARCH ref_search;
  REF_DBL center[3], radius;
  REF_DBL scale = 1.0 + 1.0e-8;

  if (ref_grid_twod(ref_grid)) {
    node_per = 2;
  } else {
    node_per = 3;
  }

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  nowned = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      nowned++;
    }
  }
  /* limit the nodes that are balanced to prevent all2all overload */
  nbalance = MIN(nowned, REF_INT_MAX / ref_mpi_n(ref_mpi));

  /* count the balanced nodes based on destination, count stationary */
  nnode = 0;
  nstationary = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      if (nnode < nbalance) {
        part = ref_part_implicit(nbalance, ref_mpi_n(ref_mpi), nnode);
        if (ref_mpi_rank(ref_mpi) == part) {
          nstationary++;
        } else {
          a_size[part]++;
        }
        nnode++;
      }
    }
  }
  ref_malloc_init(stationary, nstationary, REF_INT, REF_EMPTY);

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) { a_total += a_size[part]; }
  ref_malloc(a_xyz, 3 * a_total, REF_DBL);
  ref_malloc(a_dist, a_total, REF_DBL);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) { b_total += b_size[part]; }
  ref_malloc(b_xyz, 3 * b_total, REF_DBL);
  ref_malloc(b_dist, b_total, REF_DBL);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    a_next[part] = a_next[part - 1] + a_size[part - 1];
  }

  /* fill the balanced nodes based on destination, fill stationary */
  nnode = 0;
  nstationary = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      if (nnode < nbalance) {
        part = ref_part_implicit(nbalance, ref_mpi_n(ref_mpi), nnode);
        if (ref_mpi_rank(ref_mpi) == part) {
          stationary[nstationary] = node;
          nstationary++;
        } else {
          for (i = 0; i < 3; i++) {
            a_xyz[i + 3 * a_next[part]] = ref_node_xyz(ref_node, i, node);
          }
          a_next[part]++;
        }
        nnode++;
      }
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_xyz, a_size, b_xyz, b_size, 3, REF_DBL_TYPE),
      "alltoallv xyz");

  for (node = 0; node < b_total; node++) {
    b_dist[node] = REF_DBL_MAX;
  }
  each_ref_node_valid_node(ref_node, node) { distance[node] = REF_DBL_MAX; }

  RSS(ref_phys_local_wall(ref_grid, ref_dict, &local_node_per, &local_ncell,
                          &local_xyz),
      "local wall");
  REIS(node_per, local_node_per, "node_per miss match");

  ref_malloc(part_ncell, ref_mpi_n(ref_mpi), REF_INT);
  RSS(ref_mpi_allgather(ref_mpi, &local_ncell, part_ncell, REF_INT_TYPE),
      "allgather part ncell");

  max_ncell = 1000000; /* (8 * 3 * node_per) bytes per element */

  part_complete = 0;
  while (part_complete < ref_mpi_n(ref_mpi)) {
    xyz = NULL;
    ncell = 0;
    RSS(ref_phys_bcast_parts(ref_mpi, &part_complete, part_ncell, max_ncell,
                             node_per, local_xyz, &ncell, &xyz),
        "bcast part");

    RSS(ref_search_create(&ref_search, ncell), "make search");
    ref_malloc(permutation, ncell, REF_INT);
    /* permutation randomizes tree insertion to improve balance/reduce depth */
    RSS(ref_sort_shuffle(ncell, permutation), "shuffle");
    for (i = 0; i < ncell; i++) {
      cell = permutation[i];
      RSS(ref_node_bounding_sphere_xyz(&(xyz[3 * node_per * cell]), node_per,
                                       center, &radius),
          "bound");
      RSS(ref_search_insert(ref_search, cell, center, scale * radius), "ins");
    }
    ref_free(permutation);

    for (i = 0; i < b_total; i++) {
      RSS(ref_search_nearest_element(ref_search, node_per, xyz, &(b_xyz[3 * i]),
                                     &(b_dist[i])),
          "balanced candidates");
    }
    for (i = 0; i < nstationary; i++) {
      node = stationary[i];
      RSS(ref_search_nearest_element(
              ref_search, node_per, xyz,
              ref_node_xyz_ptr(ref_grid_node(ref_grid), node),
              &(distance[node])),
          "stationary candidates");
    }
    RSS(ref_search_free(ref_search), "free");

    ref_free(xyz);
  }

  ref_free(part_ncell);
  ref_free(local_xyz);

  RSS(ref_mpi_alltoallv(ref_mpi, b_dist, b_size, a_dist, a_size, 1,
                        REF_DBL_TYPE),
      "alltoallv dist");

  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    a_next[part] = a_next[part - 1] + a_size[part - 1];
  }
  nnode = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      if (nnode < nbalance) {
        part = ref_part_implicit(nbalance, ref_mpi_n(ref_mpi), nnode);
        if (ref_mpi_rank(ref_mpi) == part) {
        } else {
          distance[node] = a_dist[a_next[part]];
          a_next[part]++;
        }
        nnode++;
      }
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, distance, 1), "ghost distance");

  ref_free(b_dist);
  ref_free(b_xyz);
  ref_free(a_dist);
  ref_free(a_xyz);
  ref_free(a_next);
  ref_free(stationary);
  ref_free(b_size);
  ref_free(a_size);
  return REF_SUCCESS;
}